

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::create_alpha_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  alpha_cluster *paVar5;
  color_quad_u8 (*pacVar6) [16];
  ulong uVar7;
  uint s_2;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  uint uVar13;
  uint s;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint s_1;
  int iVar17;
  ulong uVar18;
  long lVar19;
  uint best_error;
  uint uVar20;
  ulong uVar21;
  uint E6 [8] [64];
  uint local_a48;
  int local_a38 [128];
  int local_838 [64];
  int aiStack_738 [64];
  int aiStack_638 [64];
  int aiStack_538 [64];
  int aiStack_438 [64];
  int aiStack_338 [64];
  int aiStack_238 [64];
  int aiStack_138 [66];
  
  uVar15 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
  uVar8 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  uVar9 = (uVar8 * data) / uVar15;
  while( true ) {
    local_a48 = (uint)(((data + 1) * uVar8) / uVar15);
    uVar13 = (uint)uVar9;
    if (local_a48 <= uVar13) break;
    for (uVar21 = 1; uVar21 < this->m_num_alpha_blocks + 1; uVar21 = uVar21 + 1) {
      uVar18 = uVar9 & 0xffffffff;
      if (this->m_has_subblocks != false) {
        uVar18 = (ulong)(uVar13 * 2);
      }
      uVar4 = (this->m_params).m_alpha_component_indices[uVar21 - 1];
      uVar3 = (this->m_endpoint_indices).m_p[uVar18].field_0.component[uVar21];
      paVar5 = (this->m_alpha_clusters).m_p;
      pacVar6 = this->m_blocks;
      piVar11 = local_a38;
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
        bVar2 = pacVar6[uVar9 & 0xffffffff][lVar12].field_0.c[uVar4];
        for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
          iVar17 = (uint)bVar2 - paVar5[uVar3].alpha_values[lVar16];
          piVar11[lVar16] = iVar17 * iVar17;
        }
        piVar11 = piVar11 + 8;
      }
      piVar11 = local_838;
      for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
        for (uVar18 = 0; uVar18 != 0x40; uVar18 = uVar18 + 1) {
          piVar11[uVar18] =
               local_a38[(lVar12 * 2 + 1) * 8 + (uVar18 >> 3 & 0x1fffffff)] +
               local_a38[lVar12 * 0x10 + (ulong)((uint)uVar18 & 7)];
        }
        piVar11 = piVar11 + 0x40;
      }
      uVar18 = 0;
      uVar20 = 0xffffffff;
      for (uVar10 = 0; (this->m_alpha_selectors).m_size != uVar10; uVar10 = uVar10 + 1) {
        uVar7 = (this->m_alpha_selectors).m_p[uVar10];
        uVar14 = (uint)(uVar7 >> 0x20);
        uVar14 = *(int *)((long)aiStack_738 + (ulong)((uint)(uVar7 >> 4) & 0xfc)) +
                 local_838[(uint)uVar7 & 0x3f] +
                 *(int *)((long)aiStack_638 + (ulong)((uint)(uVar7 >> 10) & 0xfc)) +
                 *(int *)((long)aiStack_538 + (ulong)((uint)(uVar7 >> 0x10) & 0xfc)) +
                 *(int *)((long)aiStack_438 + (ulong)((uint)(uVar7 >> 0x16) & 0xfc)) +
                 aiStack_338[(uint)(uVar7 >> 0x1e) & 0x3f] + aiStack_238[uVar14 >> 4 & 0x3f] +
                 aiStack_138[uVar14 >> 10 & 0x3f];
        if (uVar14 < uVar20) {
          uVar18 = uVar10 & 0xffffffff;
          uVar20 = uVar14;
        }
      }
      if (paVar5[uVar3].refined_alpha != false) {
        piVar11 = local_a38;
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
          bVar2 = pacVar6[uVar9 & 0xffffffff][lVar12].field_0.c[uVar4];
          for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
            iVar17 = (uint)bVar2 - paVar5[uVar3].refined_alpha_values[lVar16];
            piVar11[lVar16] = iVar17 * iVar17;
          }
          piVar11 = piVar11 + 8;
        }
      }
      lVar12 = *pData_ptr + uVar18 * 0x204;
      piVar11 = local_a38;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        for (lVar19 = 0; lVar19 != 8; lVar19 = lVar19 + 1) {
          piVar1 = (int *)(lVar12 + lVar19 * 4);
          *piVar1 = *piVar1 + piVar11[lVar19];
        }
        piVar11 = piVar11 + 8;
        lVar12 = lVar12 + 0x20;
      }
      *(undefined1 *)(*pData_ptr + 0x200 + uVar18 * 0x204) = 1;
      uVar10 = uVar9 & 0xffffffff;
      if (this->m_has_subblocks != false) {
        uVar10 = (ulong)(uVar13 * 2);
      }
      (this->m_selector_indices).m_p[uVar10].field_0.component[uVar21] = (uint16)uVar18;
    }
    uVar9 = (ulong)(uVar13 + 1);
  }
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook_task(uint64 data, void* pData_ptr) {
  crnlib::vector<alpha_selector_details>& selector_details = *static_cast<crnlib::vector<alpha_selector_details>*>(pData_ptr);
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint E3[16][8];
  uint E6[8][64];
  for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++) {
    for (uint c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
      const uint alpha_pixel_comp = m_params.m_alpha_component_indices[c - cAlpha0];
      alpha_cluster& cluster = m_alpha_clusters[m_endpoint_indices[m_has_subblocks ? b << 1 : b].component[c]];
      uint* block_values = cluster.alpha_values;
      for (uint p = 0; p < 16; p++) {
        for (uint s = 0; s < 8; s++) {
          int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
          E3[p][s] = delta * delta;
        }
      }
      for (uint p = 0; p < 8; p++) {
        for (uint s = 0; s < 64; s++)
          E6[p][s] = E3[p << 1][s & 7] + E3[p << 1 | 1][s >> 3];
      }
      uint best_index = 0;
      for (uint best_error = cUINT32_MAX, s = 0; s < m_alpha_selectors.size(); s++) {
        uint64 selector = m_alpha_selectors[s];
        uint error = E6[0][selector & 63];
        error += E6[1][selector >> 6 & 63];
        error += E6[2][selector >> 12 & 63];
        error += E6[3][selector >> 18 & 63];
        error += E6[4][selector >> 24 & 63];
        error += E6[5][selector >> 30 & 63];
        error += E6[6][selector >> 36 & 63];
        error += E6[7][selector >> 42 & 63];
        if (error < best_error) {
          best_error = error;
          best_index = s;
        }
      }
      if (cluster.refined_alpha) {
        block_values = cluster.refined_alpha_values;
        for (uint p = 0; p < 16; p++) {
          for (uint s = 0; s < 8; s++) {
            int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
            E3[p][s] = delta * delta;
          }
        }
      }
      uint (&total_errors)[16][8] = selector_details[best_index].error;
      for (uint p = 0; p < 16; p++) {
        for (uint s = 0; s < 8; s++)
         total_errors[p][s] += E3[p][s];
      }
      selector_details[best_index].used = true;
      m_selector_indices[m_has_subblocks ? b << 1 : b].component[c] = best_index;
    }
  }
}